

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
               (void)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  Column_settings *pCVar3;
  Column_settings *pCVar4;
  mapped_type *pmVar5;
  int local_9f4;
  undefined8 local_9f0;
  undefined4 *local_9e8;
  undefined4 ****local_9e0;
  char *local_9d8;
  shared_count sStack_9d0;
  undefined8 *local_9c8;
  undefined **local_9c0;
  char *local_9b8;
  undefined8 *local_9b0;
  undefined4 **local_9a8;
  undefined4 local_99c;
  undefined4 **local_998;
  char *local_990;
  undefined8 local_988;
  char *local_980;
  shared_count sStack_978;
  undefined4 ***local_970;
  ulong local_968;
  shared_count sStack_960;
  char *local_958;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mm;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mb;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mc1;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mr;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  mc2;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
            ();
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mb.colSettings_ = (Column_settings *)birth_comp;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
              *)&m.matrix_,m.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)&mb,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  if (mr.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mr,&mr,3);
  }
  if (mb.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mb.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mb,&mb,3);
  }
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_158,0x15f);
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ee0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x200267;
  local_9e0 = &local_970;
  local_970 = (undefined4 ***)CONCAT44(local_970._4_4_,(int)m.matrix_.matrix_._M_h._M_element_count)
  ;
  local_9c0 = (undefined **)&local_988;
  mc2.colSettings_ =
       (Column_settings *)
       CONCAT71(mc2.colSettings_._1_7_,(int)m.matrix_.matrix_._M_h._M_element_count == 0);
  local_988 = (char *)((ulong)local_988._4_4_ << 0x20);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mm.colSettings_ = (Column_settings *)anon_var_dwarf_75ed1;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x20035c;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_9e0;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mb.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mb.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244e28;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_9c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8));
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mb.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mb.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
              *)&mb.matrix_,&ordered_boundaries,mb.colSettings_,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  if (mc1.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mc1,&mc1,3);
  }
  if (mr.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mr,&mr,3);
  }
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x163);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ee0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x200267;
  local_970 = &local_998;
  mm.colSettings_ =
       (Column_settings *)
       CONCAT71(mm.colSettings_._1_7_,(int)mb.matrix_.matrix_._M_h._M_element_count == 7);
  local_998._0_4_ = 7;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_9e0 = (undefined4 ****)0x2002e9;
  local_9d8 = "";
  local_9c0 = (undefined **)&local_988;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244e28;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_970;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_9c0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mm.matrix_.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8));
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x164);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ee0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x200267;
  mr.colSettings_ = (Column_settings *)CONCAT44(mr.colSettings_._4_4_,2);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mb.matrix_.matrix_,(key_type *)&mr);
  local_988._0_4_ = (pmVar5->super_Column_dimension_option).dim_;
  local_998._0_4_ = 0;
  mm.colSettings_ = (Column_settings *)CONCAT71(mm.colSettings_._1_7_,(uint)local_988 == 0);
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_9e0 = (undefined4 ****)0x2002e9;
  local_9d8 = "";
  local_9c0 = (undefined **)&local_988;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_970 = &local_998;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_970;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_9c0;
  boost::test_tools::tt_detail::report_assertion
            (&mm,&mc2,&local_9e0,0x164,1,2,2,"mb.get_column_dimension(2)",&mr,"0",&mc1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mm.matrix_.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8));
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x165);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ee0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x200267;
  mr.colSettings_ = (Column_settings *)CONCAT44(mr.colSettings_._4_4_,6);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mb.matrix_.matrix_,(key_type *)&mr);
  iVar1 = (pmVar5->super_Column_dimension_option).dim_;
  local_988 = (char *)CONCAT44(local_988._4_4_,iVar1);
  local_998 = (undefined4 **)CONCAT44(local_998._4_4_,2);
  mm.colSettings_ = (Column_settings *)CONCAT71(mm.colSettings_._1_7_,iVar1 == 2);
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_9e0 = (undefined4 ****)0x2002e9;
  local_9d8 = "";
  local_9c0 = (undefined **)&local_988;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  local_970 = &local_998;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_970;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_9c0;
  boost::test_tools::tt_detail::report_assertion
            (&mm,&mc2,&local_9e0,0x165,1,2,2,"mb.get_column_dimension(6)",&mr,"2",&mc1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mm.matrix_.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8));
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc1.colSettings_ = (Column_settings *)birth_comp;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc2.colSettings_ = (Column_settings *)death_comp;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mr.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mr.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
              *)&mr.matrix_,5,mr.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
  if (mc2.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mc2,&mc2,3);
  }
  if (mc1.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mc1,&mc1,3);
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x169);
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mm.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ee0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x200267;
  local_998 = (undefined4 **)CONCAT44(local_998._4_4_,(int)mr.matrix_.matrix_._M_h._M_element_count)
  ;
  local_988 = (char *)&local_9f0;
  local_9e0 = (undefined4 ****)
              CONCAT71(local_9e0._1_7_,(int)mr.matrix_.matrix_._M_h._M_element_count == 0);
  local_9f0 = (int *)((ulong)local_9f0._4_4_ << 0x20);
  local_9d8 = (char *)0x0;
  sStack_9d0.pi_ = (sp_counted_base *)0x0;
  local_9c0 = (undefined **)0x2002e9;
  local_9b8 = "";
  local_970 = &local_998;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244e28;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_970;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_988;
  boost::test_tools::tt_detail::report_assertion
            (&local_9e0,&mm,&local_9c0,0x169,1,2,2,"mr.get_number_of_columns()",&mc1,"0",&mc2);
  boost::detail::shared_count::~shared_count(&sStack_9d0);
  mc1.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mc1.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::Chain_matrix(&mc1.matrix_,&mb.matrix_,mc1.colSettings_);
  mc2.colSettings_ = (Column_settings *)operator_new(0x38);
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((mc2.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::Chain_matrix(&mc2.matrix_,&mb.matrix_,mc2.colSettings_);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x16e);
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ee0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = (undefined4 **)0x200267;
  local_998 = &local_9e8;
  local_9f0 = &local_9f4;
  local_9f4 = 7;
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_980 = "";
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mm.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244e28;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_998;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_970._0_1_ = (int)mc1.matrix_.matrix_._M_h._M_element_count == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_960);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_218,0x16f);
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ee0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = (undefined4 **)0x200267;
  mm.colSettings_ = (Column_settings *)CONCAT44(mm.colSettings_._4_4_,2);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mc1.matrix_.matrix_,(key_type *)&mm);
  local_9e8._0_4_ = (pmVar5->super_Column_dimension_option).dim_;
  local_9f4 = 0;
  local_970._0_1_ = (int)local_9e8 == 0;
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_980 = "";
  local_998 = &local_9e8;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mm.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_998;
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_970,&local_9c0,&local_988,0x16f,1,2,2,"mc1.get_column_dimension(2)",&mm,"0",
             &local_9e0);
  boost::detail::shared_count::~shared_count(&sStack_960);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x170);
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ee0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = (undefined4 **)0x200267;
  mm.colSettings_ = (Column_settings *)CONCAT44(mm.colSettings_._4_4_,6);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mc1.matrix_.matrix_,(key_type *)&mm);
  local_9e8._0_4_ = (pmVar5->super_Column_dimension_option).dim_;
  local_9f4 = 2;
  local_970._0_1_ = (int)local_9e8 == 2;
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_980 = "";
  local_998 = &local_9e8;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mm.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_998;
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_970,&local_9c0,&local_988,0x170,1,2,2,"mc1.get_column_dimension(6)",&mm,"2",
             &local_9e0);
  boost::detail::shared_count::~shared_count(&sStack_960);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x171);
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ee0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = (undefined4 **)0x200267;
  local_970._0_1_ = (int)mc2.matrix_.matrix_._M_h._M_element_count == 7;
  local_9f4 = 7;
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_980 = "";
  local_998 = &local_9e8;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mm.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244e28;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_998;
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_960);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x172);
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ee0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = (undefined4 **)0x200267;
  mm.colSettings_ = (Column_settings *)CONCAT44(mm.colSettings_._4_4_,2);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mc2.matrix_.matrix_,(key_type *)&mm);
  local_9e8._0_4_ = (pmVar5->super_Column_dimension_option).dim_;
  local_9f4 = 0;
  local_970._0_1_ = (int)local_9e8 == 0;
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_980 = "";
  local_998 = &local_9e8;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mm.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_998;
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_970,&local_9c0,&local_988,0x172,1,2,2,"mc2.get_column_dimension(2)",&mm,"0",
             &local_9e0);
  boost::detail::shared_count::~shared_count(&sStack_960);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x173);
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ee0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = (undefined4 **)0x200267;
  mm.colSettings_ = (Column_settings *)CONCAT44(mm.colSettings_._4_4_,6);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mc2.matrix_.matrix_,(key_type *)&mm);
  iVar1 = (pmVar5->super_Column_dimension_option).dim_;
  local_9e8 = (undefined4 *)CONCAT44(local_9e8._4_4_,iVar1);
  local_9f4 = 2;
  local_970 = (undefined4 ***)CONCAT71(local_970._1_7_,iVar1 == 2);
  local_968 = 0;
  sStack_960.pi_ = (sp_counted_base *)0x0;
  local_988 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_980 = "";
  local_998 = &local_9e8;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mm.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_00244ea0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_998;
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_970,&local_9c0,&local_988,0x173,1,2,2,"mc2.get_column_dimension(6)",&mm,"2",
             &local_9e0);
  boost::detail::shared_count::~shared_count(&sStack_960);
  mm.matrix_.super_Matrix_dimension_option.maxDim_ =
       mb.matrix_.super_Matrix_dimension_option.maxDim_;
  mm.colSettings_ = mb.colSettings_;
  mb.colSettings_ = (Column_settings *)0x0;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = mb.matrix_.super_Matrix_dimension_option.dimensions_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = mb.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  mm.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       mb.matrix_.super_Matrix_dimension_option.dimensions_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mb.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mb.matrix_.super_Matrix_dimension_option.maxDim_ = -1;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ = 0;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker =
       mb.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker;
  if (mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
    _M_object = mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor.
                _M_unused._M_object;
    mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
         mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_;
    mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
         mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager;
    mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
         (_Manager_type)0x0;
    mb.matrix_.super_Chain_vine_swap_option.birthComp_._M_invoker = (_Invoker_type)0x0;
  }
  mm.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mm.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ = 0;
  mm.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  mm.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker =
       mb.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker;
  if (mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    mm.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._M_unused.
    _M_object = mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor.
                _M_unused._M_object;
    mm.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_ =
         mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor._8_8_;
    mm.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
         mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager;
    mb.matrix_.super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
         (_Manager_type)0x0;
    mb.matrix_.super_Chain_vine_swap_option.deathComp_._M_invoker = (_Invoker_type)0x0;
  }
  mm.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._0_4_;
  mm.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start._4_4_;
  mm.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._0_4_;
  mm.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish._4_4_;
  mm.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  mm.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  mm.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  mm.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.representativeCycles_.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mm.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  mm.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  mm.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  mm.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ =
       mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mb.matrix_.super_Chain_representative_cycles_option.birthToCycle_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&mm.matrix_.matrix_._M_h,&mb.matrix_.matrix_);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&mm.matrix_.pivotToColumnIndex_._M_h,&mb.matrix_.pivotToColumnIndex_);
  mm.matrix_.colSettings_ = mb.matrix_.colSettings_;
  mm.matrix_.nextIndex_ = mb.matrix_.nextIndex_;
  mb.matrix_.nextIndex_ = 0;
  mb.matrix_.colSettings_ = (Column_settings *)0x0;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x177);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9f4 = (int)mm.matrix_.matrix_._M_h._M_element_count;
  local_99c = 7;
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244e28;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  local_988._0_1_ = (int)mm.matrix_.matrix_._M_h._M_element_count == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_978);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2d8,0x178);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9e0 = (undefined4 ****)CONCAT44(local_9e0._4_4_,2);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mm.matrix_.matrix_,(key_type *)&local_9e0);
  local_9f4 = (pmVar5->super_Column_dimension_option).dim_;
  local_99c = 0;
  local_988._0_1_ = local_9f4 == 0;
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  boost::test_tools::tt_detail::report_assertion
            (&local_988,&local_970,&local_998,0x178,1,2,2,"mm.get_column_dimension(2)",&local_9e0,
             "0",&local_9c0);
  boost::detail::shared_count::~shared_count(&sStack_978);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f8,0x179);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9e0 = (undefined4 ****)CONCAT44(local_9e0._4_4_,6);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mm.matrix_.matrix_,(key_type *)&local_9e0);
  local_9f4 = (pmVar5->super_Column_dimension_option).dim_;
  local_99c = 2;
  local_988._0_1_ = local_9f4 == 2;
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  boost::test_tools::tt_detail::report_assertion
            (&local_988,&local_970,&local_998,0x179,1,2,2,"mm.get_column_dimension(6)",&local_9e0,
             "2",&local_9c0);
  boost::detail::shared_count::~shared_count(&sStack_978);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0x17a);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9f4 = (int)mb.matrix_.matrix_._M_h._M_element_count;
  local_988._0_1_ = (int)mb.matrix_.matrix_._M_h._M_element_count == 0;
  local_99c = 0;
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244e28;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_978);
  Gudhi::persistence_matrix::swap(&mm.matrix_,&mb.matrix_);
  pCVar3 = mm.colSettings_;
  mm.colSettings_ = mb.colSettings_;
  mb.colSettings_ = pCVar3;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_338,0x17e);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9f4 = (int)mm.matrix_.matrix_._M_h._M_element_count;
  local_988._0_1_ = (int)mm.matrix_.matrix_._M_h._M_element_count == 0;
  local_99c = 0;
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244e28;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_978);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_358,0x17f);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9f4 = (int)mb.matrix_.matrix_._M_h._M_element_count;
  local_988._0_1_ = (int)mb.matrix_.matrix_._M_h._M_element_count == 7;
  local_99c = 7;
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244e28;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_978);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_378,0x180);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9e0 = (undefined4 ****)CONCAT44(local_9e0._4_4_,2);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mb.matrix_.matrix_,(key_type *)&local_9e0);
  local_9f4 = (pmVar5->super_Column_dimension_option).dim_;
  local_99c = 0;
  local_988._0_1_ = local_9f4 == 0;
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  boost::test_tools::tt_detail::report_assertion
            (&local_988,&local_970,&local_998,0x180,1,2,2,"mb.get_column_dimension(2)",&local_9e0,
             "0",&local_9c0);
  boost::detail::shared_count::~shared_count(&sStack_978);
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_390 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_398,0x181);
  local_968 = local_968 & 0xffffffffffffff00;
  local_970 = (undefined4 ***)&PTR__lazy_ostream_00244ee0;
  sStack_960.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_958 = "";
  local_9e0 = (undefined4 ****)CONCAT44(local_9e0._4_4_,6);
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&mb.matrix_.matrix_,(key_type *)&local_9e0);
  local_9f4 = (pmVar5->super_Column_dimension_option).dim_;
  local_99c = 2;
  local_988 = (char *)CONCAT71(local_988._1_7_,local_9f4 == 2);
  local_980 = (char *)0x0;
  sStack_978.pi_ = (sp_counted_base *)0x0;
  local_998 = (undefined4 **)0x2002e9;
  local_990 = "";
  local_9f0 = &local_9f4;
  local_9d8 = (char *)((ulong)local_9d8 & 0xffffffffffffff00);
  local_9e0 = (undefined4 ****)&PTR__lazy_ostream_00244ea0;
  sStack_9d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_9c8 = &local_9f0;
  local_9b8 = (char *)((ulong)local_9b8 & 0xffffffffffffff00);
  local_9c0 = &PTR__lazy_ostream_00244ea0;
  local_9b0 = &boost::unit_test::lazy_ostream::inst;
  local_9a8 = &local_9e8;
  local_9e8 = &local_99c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_978);
  pCVar3 = mm.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&mm.matrix_.matrix_._M_h);
  while (mm.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var2 = (mm.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(mm.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    mm.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var2;
  }
  memset(mm.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         mm.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar4 = mm.colSettings_;
  mm.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mm.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  mm.matrix_.nextIndex_ = 0;
  mm.matrix_.colSettings_ = pCVar3;
  if (mm.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)mm.colSettings_);
    operator_delete(pCVar4,0x38);
  }
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&mm.matrix_);
  pCVar3 = mc2.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&mc2.matrix_.matrix_._M_h);
  while (mc2.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var2 = (mc2.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(mc2.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    mc2.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var2;
  }
  memset(mc2.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         mc2.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar4 = mc2.colSettings_;
  mc2.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mc2.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  mc2.matrix_.nextIndex_ = 0;
  mc2.matrix_.colSettings_ = pCVar3;
  if (mc2.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)mc2.colSettings_);
    operator_delete(pCVar4,0x38);
  }
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&mc2.matrix_);
  pCVar3 = mc1.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&mc1.matrix_.matrix_._M_h);
  while (mc1.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var2 = (mc1.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(mc1.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    mc1.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var2;
  }
  memset(mc1.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         mc1.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar4 = mc1.colSettings_;
  mc1.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mc1.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  mc1.matrix_.nextIndex_ = 0;
  mc1.matrix_.colSettings_ = pCVar3;
  if (mc1.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)mc1.colSettings_);
    operator_delete(pCVar4,0x38);
  }
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&mc1.matrix_);
  pCVar3 = mr.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&mr.matrix_.matrix_._M_h);
  while (mr.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var2 = (mr.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(mr.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    mr.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var2;
  }
  memset(mr.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         mr.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar4 = mr.colSettings_;
  mr.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mr.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  mr.matrix_.nextIndex_ = 0;
  mr.matrix_.colSettings_ = pCVar3;
  if (mr.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)mr.colSettings_);
    operator_delete(pCVar4,0x38);
  }
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&mr.matrix_);
  pCVar3 = mb.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&mb.matrix_.matrix_._M_h);
  while (mb.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var2 = (mb.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(mb.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    mb.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var2;
  }
  memset(mb.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         mb.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar4 = mb.colSettings_;
  mb.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mb.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  mb.matrix_.nextIndex_ = 0;
  mb.matrix_.colSettings_ = pCVar3;
  if (mb.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)mb.colSettings_);
    operator_delete(pCVar4,0x38);
  }
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&mb.matrix_);
  pCVar3 = m.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&m.matrix_.matrix_._M_h);
  while (m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    p_Var2 = (m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var2;
  }
  memset(m.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         m.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar4 = m.colSettings_;
  m.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  m.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  m.matrix_.nextIndex_ = 0;
  m.matrix_.colSettings_ = pCVar3;
  if (m.colSettings_ != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)m.colSettings_);
    operator_delete(pCVar4,0x38);
  }
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&m.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&ordered_boundaries);
  return;
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}